

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.h
# Opt level: O2

void __thiscall
OrderMoney::OrderMoney<std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
          (OrderMoney *this,string *currency,shared_ptr<const_Bank> *bank,
          shared_ptr<RealMoney> *money,shared_ptr<RealMoney> *money_1)

{
  shared_ptr<RealMoney> local_78;
  shared_ptr<const_Money> local_68;
  shared_ptr<RealMoney> local_58;
  shared_ptr<const_Money> local_48;
  
  std::
  make_shared<ExchangedMoney,std::shared_ptr<RealMoney>const&,std::shared_ptr<Bank_const>const&,std::__cxx11::string_const&>
            (&local_58,(shared_ptr<const_Bank> *)money,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bank);
  local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_58.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Money;
  local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_58.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_58.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_58.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  make_shared<ExchangedMoney,std::shared_ptr<RealMoney>const&,std::shared_ptr<Bank_const>const&,std::__cxx11::string_const&>
            (&local_78,(shared_ptr<const_Bank> *)money_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bank);
  local_68.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_78.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Money;
  local_68.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_78.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_78.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_78.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  OrderMoney(this,&local_48,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<RealMoney,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

OrderMoney(
		const std::string &currency,
		const std::shared_ptr<const Bank> &bank,
		const T & ... money
	) : OrderMoney(std::make_shared<ExchangedMoney>(money, bank, currency)...)
	{
	}